

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O0

TestStatus *
vkt::anon_unknown_0::logPlatformInfo(TestStatus *__return_storage_ptr__,Context *context)

{
  int iVar1;
  TestContext *pTVar2;
  Platform *pPVar3;
  undefined4 extraout_var;
  TestLog *this;
  MessageBuilder *this_00;
  allocator<char> local_361;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  MessageBuilder local_320;
  ostringstream local_190 [8];
  ostringstream details;
  Context *context_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pTVar2 = Context::getTestContext(context);
  pPVar3 = tcu::TestContext::getPlatform(pTVar2);
  iVar1 = (*pPVar3->_vptr_Platform[5])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
            ((long *)CONCAT44(extraout_var,iVar1),local_190);
  pTVar2 = Context::getTestContext(context);
  this = tcu::TestContext::getLog(pTVar2);
  tcu::TestLog::operator<<(&local_320,this,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::ostringstream::str();
  this_00 = tcu::MessageBuilder::operator<<(&local_320,&local_340);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_340);
  tcu::MessageBuilder::~MessageBuilder(&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Not validated",&local_361);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus logPlatformInfo (Context& context)
{
	std::ostringstream details;

	context.getTestContext().getPlatform().getVulkanPlatform().describePlatform(details);

	context.getTestContext().getLog()
		<< TestLog::Message
		<< details.str()
		<< TestLog::EndMessage;

	return tcu::TestStatus::pass("Not validated");
}